

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O2

void toggle_layer(Layer layer)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  EmulatorConfig emu_config;
  EmulatorConfig local_34;
  
  emulator_get_config(e);
  *(undefined1 *)(local_34.disable_sound + (ulong)layer + 4) =
       (char)local_34.disable_sound[(ulong)layer + 4] ^ TRUE;
  emulator_set_config(e,&local_34);
  pcVar3 = "__";
  if (local_34.disable_bg == FALSE) {
    pcVar3 = "bg";
  }
  pcVar2 = "win";
  if (local_34.disable_window != FALSE) {
    pcVar2 = "___";
  }
  pcVar1 = "obj";
  if (local_34.disable_obj != FALSE) {
    pcVar1 = "___";
  }
  set_status_text("Layer: %s %s %s",pcVar3,pcVar2,pcVar1);
  return;
}

Assistant:

static void toggle_layer(Layer layer) {
  EmulatorConfig emu_config = emulator_get_config(e);
  switch (layer) {
    case LAYER_BG: emu_config.disable_bg ^= 1; break;
    case LAYER_WINDOW: emu_config.disable_window ^= 1; break;
    case LAYER_OBJ: emu_config.disable_obj ^= 1; break;
  }
  emulator_set_config(e, &emu_config);
  set_status_text("Layer: %s %s %s", emu_config.disable_bg ? "__" : "bg",
                  emu_config.disable_window ? "___" : "win",
                  emu_config.disable_obj ? "___" : "obj");
}